

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

void __thiscall QPDFJob::AttConfig::AttConfig(AttConfig *this,Config *c)

{
  Config *c_local;
  AttConfig *this_local;
  
  this->config = c;
  AddAttachment::AddAttachment(&this->att);
  return;
}

Assistant:

QPDFJob::AttConfig::AttConfig(Config* c) :
    config(c)
{
}